

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
::_add_to(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
          *this,Column *column,Tmp_column *set,uint coef)

{
  uint uVar1;
  Column_settings *this_00;
  uint uVar2;
  undefined8 in_RAX;
  iterator __position;
  node_ptr plVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar4;
  undefined8 uStack_38;
  
  this_00 = this->colSettings_;
  plVar3 = (node_ptr)&column->column_;
  uStack_38 = in_RAX;
  while (plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_,
        plVar3 != (node_ptr)&column->column_) {
    uStack_38 = CONCAT44(*(undefined4 *)&plVar3[1].next_,(undefined4)uStack_38);
    pVar4 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
            ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                        *)set,(uint *)((long)&uStack_38 + 4),(uint *)&plVar3[-1].prev_);
    __position._M_node = (_Base_ptr)pVar4.first._M_node;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar2 = *(uint *)&plVar3[-1].prev_ * coef + *(int *)&__position._M_node[1].field_0x4;
      uVar1 = (this_00->operators).characteristic_;
      if (uVar1 <= uVar2) {
        uVar2 = uVar2 % uVar1;
      }
      *(uint *)&__position._M_node[1].field_0x4 = uVar2;
      if (uVar2 == 0) {
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                            *)set,__position);
      }
    }
    else {
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (&this_00->operators,(Element *)&__position._M_node[1].field_0x4,coef);
    }
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_to(const Column& column,
                                                 Tmp_column& set,
                                                 [[maybe_unused]] unsigned int coef)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    std::pair<typename std::set<Index>::iterator, bool> res_insert;
    for (const Entry& entry : column) {
      res_insert = set.insert(entry.get_row_index());
      if (!res_insert.second) {
        set.erase(res_insert.first);
      }
    }
  } else {
    auto& operators = colSettings_->operators;
    for (const Entry& entry : column) {
      auto res = set.emplace(entry.get_row_index(), entry.get_element());
      if (res.second){
        operators.multiply_inplace(res.first->second, coef);
      } else {
        operators.multiply_and_add_inplace_back(entry.get_element(), coef, res.first->second);
        if (res.first->second == Field_operators::get_additive_identity()) {
          set.erase(res.first);
        }
      }
    }
  }
}